

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall
Memory::HeapBlockMap32::Cleanup(HeapBlockMap32 *this,bool concurrentFindImplicitRoot)

{
  L2MapChunk *this_00;
  code *pcVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  long lVar6;
  HeapAllocator *this_01;
  undefined7 in_register_00000031;
  long lVar7;
  
  puVar5 = (undefined4 *)
           __tls_get_addr(&PTR_01548f08,CONCAT71(in_register_00000031,concurrentFindImplicitRoot));
  lVar7 = 0;
  do {
    this_00 = this->map[lVar7];
    if ((this_00 != (L2MapChunk *)0x0) && (this_00->map[0] == (HeapBlock *)0x0)) {
      lVar2 = 0x441;
      do {
        lVar6 = lVar2;
        if (lVar6 == 0x540) goto LAB_006b5f20;
        lVar2 = lVar6 + 1;
      } while ((this_00->markBits).data[lVar6].word == 0);
      if (0xfe < lVar6 - 0x441U) {
LAB_006b5f20:
        this->map[lVar7] = (L2MapChunk *)0x0;
        this_01 = HeapAllocator::GetNoMemProtectInstance();
        L2MapChunk::~L2MapChunk(this_00);
        HeapAllocator::Free(this_01,this_00,0x2c08);
        uVar4 = this->count;
        if (uVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                             ,0x49b,"(count > 0)","count > 0");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          uVar4 = this->count;
        }
        this->count = uVar4 - 1;
      }
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x1000) {
      return;
    }
  } while( true );
}

Assistant:

void
HeapBlockMap32::Cleanup(bool concurrentFindImplicitRoot)
{
    for (uint id1 = 0; id1 < L1Count; id1++)
    {
        L2MapChunk * l2map = map[id1];
        if (l2map != nullptr && l2map->IsEmpty())
        {
            // Concurrent searches for implicit roots will never see empty L2 maps.
            map[id1] = nullptr;
            NoMemProtectHeapDelete(l2map);
            Assert(count > 0);
            count--;
        }
    }
}